

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O2

RAMReport * npas4::GetRAMReport(void)

{
  int64_t iVar1;
  RAMReport *in_RDI;
  
  in_RDI->RamPhysicalUsedByCurrentProcessPeak = 0;
  iVar1 = GetRAMSystemTotal();
  in_RDI->RamSystemTotal = iVar1;
  iVar1 = GetRAMSystemAvailable();
  in_RDI->RamSystemAvailable = iVar1;
  iVar1 = GetRAMSystemUsed();
  in_RDI->RamSystemUsed = iVar1;
  iVar1 = GetRAMSystemUsedByCurrentProcess();
  in_RDI->RamSystemUsedByCurrentProcess = iVar1;
  iVar1 = GetRAMPhysicalTotal();
  in_RDI->RamPhysicalTotal = iVar1;
  iVar1 = GetRAMPhysicalAvailable();
  in_RDI->RamPhysicalAvailable = iVar1;
  iVar1 = GetRAMPhysicalUsed();
  in_RDI->RamPhysicalUsed = iVar1;
  iVar1 = GetRAMPhysicalUsedByCurrentProcess();
  in_RDI->RamPhysicalUsedByCurrentProcess = iVar1;
  iVar1 = GetRAMVirtualTotal();
  in_RDI->RamVirtualTotal = iVar1;
  iVar1 = GetRAMVirtualAvailable();
  in_RDI->RamVirtualAvailable = iVar1;
  iVar1 = GetRAMVirtualUsed();
  in_RDI->RamVirtualUsed = iVar1;
  iVar1 = GetRAMVirtualUsedByCurrentProcess();
  in_RDI->RamVirtualUsedByCurrentProcess = iVar1;
  return in_RDI;
}

Assistant:

npas4::RAMReport npas4::GetRAMReport()
{
	npas4::RAMReport r;
	r.RamSystemTotal = GetRAMSystemTotal();
	r.RamSystemAvailable = GetRAMSystemAvailable();
	r.RamSystemUsed = GetRAMSystemUsed();
	r.RamSystemUsedByCurrentProcess = GetRAMSystemUsedByCurrentProcess();
	r.RamPhysicalTotal = GetRAMPhysicalTotal();
	r.RamPhysicalAvailable = GetRAMPhysicalAvailable();
	r.RamPhysicalUsed = GetRAMPhysicalUsed();
	r.RamPhysicalUsedByCurrentProcess = GetRAMPhysicalUsedByCurrentProcess();
	r.RamVirtualTotal = GetRAMVirtualTotal();
	r.RamVirtualAvailable = GetRAMVirtualAvailable();
	r.RamVirtualUsed = GetRAMVirtualUsed();
	r.RamVirtualUsedByCurrentProcess = GetRAMVirtualUsedByCurrentProcess();
	return r;
}